

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

void cfd::api::json::ElementsDecodeRawTransactionTxOut::CollectFieldName(void)

{
  bool bVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>_>_>,_bool>
  pVar2;
  CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> func_table;
  CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *in_stack_fffffffffffff508
  ;
  CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *in_stack_fffffffffffff510
  ;
  CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *this;
  char (*in_stack_fffffffffffff518) [28];
  char (*__args) [11];
  function<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
  *in_stack_fffffffffffff520;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>_>_>_>
  *this_00;
  CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> local_8b9;
  allocator local_821;
  value_type local_820;
  _Base_ptr local_800;
  undefined1 local_7f8;
  allocator local_789;
  value_type local_788;
  _Base_ptr local_768;
  undefined1 local_760;
  allocator local_6f1;
  value_type local_6f0;
  _Base_ptr local_6d0;
  undefined1 local_6c8;
  allocator local_659;
  value_type local_658;
  _Base_ptr local_638;
  undefined1 local_630;
  allocator local_5c1;
  value_type local_5c0;
  _Base_ptr local_5a0;
  undefined1 local_598;
  allocator local_529;
  value_type local_528;
  _Base_ptr local_508;
  undefined1 local_500;
  allocator local_491;
  value_type local_490;
  _Base_ptr local_470;
  undefined1 local_468;
  allocator local_3f9;
  value_type local_3f8;
  _Base_ptr local_3d8;
  undefined1 local_3d0;
  allocator local_361;
  value_type local_360;
  _Base_ptr local_340;
  undefined1 local_338;
  allocator local_2c9;
  value_type local_2c8;
  _Base_ptr local_2a8;
  undefined1 local_2a0;
  allocator local_231;
  value_type local_230;
  _Base_ptr local_210;
  undefined1 local_208;
  allocator local_199;
  value_type local_198;
  _Base_ptr local_178;
  undefined1 local_170;
  allocator local_101;
  value_type local_100;
  _Base_ptr local_e0;
  undefined1 local_d8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>_>_>_>
  local_60 [2];
  
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>_>_>_>
          ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>_>_>_>
                   *)0x6abe13);
  if (bVar1) {
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::
    CLASS_FUNCTION_TABLE(in_stack_fffffffffffff510);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeRawTransactionTxOut_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeRawTransactionTxOut_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                *)in_stack_fffffffffffff520,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeRawTransactionTxOut_ptr
                *)in_stack_fffffffffffff518);
    std::function<void(cfd::api::json::ElementsDecodeRawTransactionTxOut&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeRawTransactionTxOut&,UniValue_const&),void>
              (in_stack_fffffffffffff520,
               (_func_void_ElementsDecodeRawTransactionTxOut_ptr_UniValue_ptr *)
               in_stack_fffffffffffff518);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff520,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff518);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::operator=
              (in_stack_fffffffffffff510,in_stack_fffffffffffff508);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::
    ~CLASS_FUNCTION_TABLE(in_stack_fffffffffffff510);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
            ::
            emplace<char_const(&)[6],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>_>_>_>
                        *)in_stack_fffffffffffff520,(char (*) [6])in_stack_fffffffffffff518,
                       in_stack_fffffffffffff510);
    local_e0 = (_Base_ptr)pVar2.first._M_node;
    local_d8 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_100,"value",&local_101);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeRawTransactionTxOut_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeRawTransactionTxOut_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                *)in_stack_fffffffffffff520,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeRawTransactionTxOut_ptr
                *)in_stack_fffffffffffff518);
    std::function<void(cfd::api::json::ElementsDecodeRawTransactionTxOut&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeRawTransactionTxOut&,UniValue_const&),void>
              (in_stack_fffffffffffff520,
               (_func_void_ElementsDecodeRawTransactionTxOut_ptr_UniValue_ptr *)
               in_stack_fffffffffffff518);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff520,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff518);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::operator=
              (in_stack_fffffffffffff510,in_stack_fffffffffffff508);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::
    ~CLASS_FUNCTION_TABLE(in_stack_fffffffffffff510);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
            ::
            emplace<char_const(&)[14],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>_>_>_>
                        *)in_stack_fffffffffffff520,(char (*) [14])in_stack_fffffffffffff518,
                       in_stack_fffffffffffff510);
    local_178 = (_Base_ptr)pVar2.first._M_node;
    local_170 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_198,"value-minimum",&local_199);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeRawTransactionTxOut_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeRawTransactionTxOut_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                *)in_stack_fffffffffffff520,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeRawTransactionTxOut_ptr
                *)in_stack_fffffffffffff518);
    std::function<void(cfd::api::json::ElementsDecodeRawTransactionTxOut&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeRawTransactionTxOut&,UniValue_const&),void>
              (in_stack_fffffffffffff520,
               (_func_void_ElementsDecodeRawTransactionTxOut_ptr_UniValue_ptr *)
               in_stack_fffffffffffff518);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff520,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff518);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::operator=
              (in_stack_fffffffffffff510,in_stack_fffffffffffff508);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::
    ~CLASS_FUNCTION_TABLE(in_stack_fffffffffffff510);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
            ::
            emplace<char_const(&)[14],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>_>_>_>
                        *)in_stack_fffffffffffff520,(char (*) [14])in_stack_fffffffffffff518,
                       in_stack_fffffffffffff510);
    local_210 = (_Base_ptr)pVar2.first._M_node;
    local_208 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_230,"value-maximum",&local_231);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeRawTransactionTxOut_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeRawTransactionTxOut_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                *)in_stack_fffffffffffff520,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeRawTransactionTxOut_ptr
                *)in_stack_fffffffffffff518);
    std::function<void(cfd::api::json::ElementsDecodeRawTransactionTxOut&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeRawTransactionTxOut&,UniValue_const&),void>
              (in_stack_fffffffffffff520,
               (_func_void_ElementsDecodeRawTransactionTxOut_ptr_UniValue_ptr *)
               in_stack_fffffffffffff518);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff520,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff518);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::operator=
              (in_stack_fffffffffffff510,in_stack_fffffffffffff508);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::
    ~CLASS_FUNCTION_TABLE(in_stack_fffffffffffff510);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
            ::
            emplace<char_const(&)[12],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>_>_>_>
                        *)in_stack_fffffffffffff520,(char (*) [12])in_stack_fffffffffffff518,
                       in_stack_fffffffffffff510);
    local_2a8 = (_Base_ptr)pVar2.first._M_node;
    local_2a0 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2c8,"ct-exponent",&local_2c9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_2c8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeRawTransactionTxOut_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeRawTransactionTxOut_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                *)in_stack_fffffffffffff520,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeRawTransactionTxOut_ptr
                *)in_stack_fffffffffffff518);
    std::function<void(cfd::api::json::ElementsDecodeRawTransactionTxOut&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeRawTransactionTxOut&,UniValue_const&),void>
              (in_stack_fffffffffffff520,
               (_func_void_ElementsDecodeRawTransactionTxOut_ptr_UniValue_ptr *)
               in_stack_fffffffffffff518);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff520,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff518);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::operator=
              (in_stack_fffffffffffff510,in_stack_fffffffffffff508);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::
    ~CLASS_FUNCTION_TABLE(in_stack_fffffffffffff510);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
            ::
            emplace<char_const(&)[8],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>_>_>_>
                        *)in_stack_fffffffffffff520,(char (*) [8])in_stack_fffffffffffff518,
                       in_stack_fffffffffffff510);
    local_340 = (_Base_ptr)pVar2.first._M_node;
    local_338 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_360,"ct-bits",&local_361);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_360);
    std::__cxx11::string::~string((string *)&local_360);
    std::allocator<char>::~allocator((allocator<char> *)&local_361);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeRawTransactionTxOut_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeRawTransactionTxOut_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                *)in_stack_fffffffffffff520,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeRawTransactionTxOut_ptr
                *)in_stack_fffffffffffff518);
    std::function<void(cfd::api::json::ElementsDecodeRawTransactionTxOut&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeRawTransactionTxOut&,UniValue_const&),void>
              (in_stack_fffffffffffff520,
               (_func_void_ElementsDecodeRawTransactionTxOut_ptr_UniValue_ptr *)
               in_stack_fffffffffffff518);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff520,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff518);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::operator=
              (in_stack_fffffffffffff510,in_stack_fffffffffffff508);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::
    ~CLASS_FUNCTION_TABLE(in_stack_fffffffffffff510);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
            ::
            emplace<char_const(&)[16],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>_>_>_>
                        *)in_stack_fffffffffffff520,(char (*) [16])in_stack_fffffffffffff518,
                       in_stack_fffffffffffff510);
    local_3d8 = (_Base_ptr)pVar2.first._M_node;
    local_3d0 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3f8,"surjectionproof",&local_3f9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_3f8);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeRawTransactionTxOut_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeRawTransactionTxOut_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                *)in_stack_fffffffffffff520,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeRawTransactionTxOut_ptr
                *)in_stack_fffffffffffff518);
    std::function<void(cfd::api::json::ElementsDecodeRawTransactionTxOut&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeRawTransactionTxOut&,UniValue_const&),void>
              (in_stack_fffffffffffff520,
               (_func_void_ElementsDecodeRawTransactionTxOut_ptr_UniValue_ptr *)
               in_stack_fffffffffffff518);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff520,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff518);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::operator=
              (in_stack_fffffffffffff510,in_stack_fffffffffffff508);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::
    ~CLASS_FUNCTION_TABLE(in_stack_fffffffffffff510);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
            ::
            emplace<char_const(&)[16],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>_>_>_>
                        *)in_stack_fffffffffffff520,(char (*) [16])in_stack_fffffffffffff518,
                       in_stack_fffffffffffff510);
    local_470 = (_Base_ptr)pVar2.first._M_node;
    local_468 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_490,"valuecommitment",&local_491);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_490);
    std::__cxx11::string::~string((string *)&local_490);
    std::allocator<char>::~allocator((allocator<char> *)&local_491);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeRawTransactionTxOut_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeRawTransactionTxOut_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                *)in_stack_fffffffffffff520,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeRawTransactionTxOut_ptr
                *)in_stack_fffffffffffff518);
    std::function<void(cfd::api::json::ElementsDecodeRawTransactionTxOut&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeRawTransactionTxOut&,UniValue_const&),void>
              (in_stack_fffffffffffff520,
               (_func_void_ElementsDecodeRawTransactionTxOut_ptr_UniValue_ptr *)
               in_stack_fffffffffffff518);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff520,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff518);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::operator=
              (in_stack_fffffffffffff510,in_stack_fffffffffffff508);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::
    ~CLASS_FUNCTION_TABLE(in_stack_fffffffffffff510);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
            ::
            emplace<char_const(&)[6],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>_>_>_>
                        *)in_stack_fffffffffffff520,(char (*) [6])in_stack_fffffffffffff518,
                       in_stack_fffffffffffff510);
    local_508 = (_Base_ptr)pVar2.first._M_node;
    local_500 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_528,"asset",&local_529);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_528);
    std::__cxx11::string::~string((string *)&local_528);
    std::allocator<char>::~allocator((allocator<char> *)&local_529);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeRawTransactionTxOut_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeRawTransactionTxOut_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                *)in_stack_fffffffffffff520,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeRawTransactionTxOut_ptr
                *)in_stack_fffffffffffff518);
    std::function<void(cfd::api::json::ElementsDecodeRawTransactionTxOut&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeRawTransactionTxOut&,UniValue_const&),void>
              (in_stack_fffffffffffff520,
               (_func_void_ElementsDecodeRawTransactionTxOut_ptr_UniValue_ptr *)
               in_stack_fffffffffffff518);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff520,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff518);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::operator=
              (in_stack_fffffffffffff510,in_stack_fffffffffffff508);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::
    ~CLASS_FUNCTION_TABLE(in_stack_fffffffffffff510);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
            ::
            emplace<char_const(&)[16],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>_>_>_>
                        *)in_stack_fffffffffffff520,(char (*) [16])in_stack_fffffffffffff518,
                       in_stack_fffffffffffff510);
    local_5a0 = (_Base_ptr)pVar2.first._M_node;
    local_598 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_5c0,"assetcommitment",&local_5c1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_5c0);
    std::__cxx11::string::~string((string *)&local_5c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeRawTransactionTxOut_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeRawTransactionTxOut_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                *)in_stack_fffffffffffff520,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeRawTransactionTxOut_ptr
                *)in_stack_fffffffffffff518);
    std::function<void(cfd::api::json::ElementsDecodeRawTransactionTxOut&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeRawTransactionTxOut&,UniValue_const&),void>
              (in_stack_fffffffffffff520,
               (_func_void_ElementsDecodeRawTransactionTxOut_ptr_UniValue_ptr *)
               in_stack_fffffffffffff518);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff520,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff518);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::operator=
              (in_stack_fffffffffffff510,in_stack_fffffffffffff508);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::
    ~CLASS_FUNCTION_TABLE(in_stack_fffffffffffff510);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
            ::
            emplace<char_const(&)[16],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>_>_>_>
                        *)in_stack_fffffffffffff520,(char (*) [16])in_stack_fffffffffffff518,
                       in_stack_fffffffffffff510);
    local_638 = (_Base_ptr)pVar2.first._M_node;
    local_630 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_658,"commitmentnonce",&local_659);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_658);
    std::__cxx11::string::~string((string *)&local_658);
    std::allocator<char>::~allocator((allocator<char> *)&local_659);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeRawTransactionTxOut_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeRawTransactionTxOut_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                *)in_stack_fffffffffffff520,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeRawTransactionTxOut_ptr
                *)in_stack_fffffffffffff518);
    std::function<void(cfd::api::json::ElementsDecodeRawTransactionTxOut&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeRawTransactionTxOut&,UniValue_const&),void>
              (in_stack_fffffffffffff520,
               (_func_void_ElementsDecodeRawTransactionTxOut_ptr_UniValue_ptr *)
               in_stack_fffffffffffff518);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff520,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff518);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::operator=
              (in_stack_fffffffffffff510,in_stack_fffffffffffff508);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::
    ~CLASS_FUNCTION_TABLE(in_stack_fffffffffffff510);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
            ::
            emplace<char_const(&)[28],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>_>_>_>
                        *)in_stack_fffffffffffff520,in_stack_fffffffffffff518,
                       in_stack_fffffffffffff510);
    local_6d0 = (_Base_ptr)pVar2.first._M_node;
    local_6c8 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_6f0,"commitmentnonce_fully_valid",&local_6f1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_6f0);
    std::__cxx11::string::~string((string *)&local_6f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_6f1);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeRawTransactionTxOut_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeRawTransactionTxOut_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                *)in_stack_fffffffffffff520,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeRawTransactionTxOut_ptr
                *)in_stack_fffffffffffff518);
    std::function<void(cfd::api::json::ElementsDecodeRawTransactionTxOut&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeRawTransactionTxOut&,UniValue_const&),void>
              (in_stack_fffffffffffff520,
               (_func_void_ElementsDecodeRawTransactionTxOut_ptr_UniValue_ptr *)
               in_stack_fffffffffffff518);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff520,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff518);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::operator=
              (in_stack_fffffffffffff510,in_stack_fffffffffffff508);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::
    ~CLASS_FUNCTION_TABLE(in_stack_fffffffffffff510);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
            ::
            emplace<char_const(&)[2],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>_>_>_>
                        *)in_stack_fffffffffffff520,(char (*) [2])in_stack_fffffffffffff518,
                       in_stack_fffffffffffff510);
    local_768 = (_Base_ptr)pVar2.first._M_node;
    local_760 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_788,"n",&local_789);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_788);
    std::__cxx11::string::~string((string *)&local_788);
    std::allocator<char>::~allocator((allocator<char> *)&local_789);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeRawTransactionTxOut_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeRawTransactionTxOut_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                *)in_stack_fffffffffffff520,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeRawTransactionTxOut_ptr
                *)in_stack_fffffffffffff518);
    std::function<void(cfd::api::json::ElementsDecodeRawTransactionTxOut&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeRawTransactionTxOut&,UniValue_const&),void>
              (in_stack_fffffffffffff520,
               (_func_void_ElementsDecodeRawTransactionTxOut_ptr_UniValue_ptr *)
               in_stack_fffffffffffff518);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff520,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff518);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::operator=
              (in_stack_fffffffffffff510,in_stack_fffffffffffff508);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::
    ~CLASS_FUNCTION_TABLE(in_stack_fffffffffffff510);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
            ::
            emplace<char_const(&)[13],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>_>_>_>
                        *)in_stack_fffffffffffff520,(char (*) [13])in_stack_fffffffffffff518,
                       in_stack_fffffffffffff510);
    local_800 = (_Base_ptr)pVar2.first._M_node;
    local_7f8 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_820,"scriptPubKey",&local_821);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_820);
    std::__cxx11::string::~string((string *)&local_820);
    std::allocator<char>::~allocator((allocator<char> *)&local_821);
    __args = (char (*) [11])((long)&local_8b9.set_function.super__Function_base._M_manager + 1);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeRawTransactionTxOut_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeRawTransactionTxOut_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
                *)in_stack_fffffffffffff520,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeRawTransactionTxOut_ptr
                *)__args);
    std::function<void(cfd::api::json::ElementsDecodeRawTransactionTxOut&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeRawTransactionTxOut&,UniValue_const&),void>
              (in_stack_fffffffffffff520,
               (_func_void_ElementsDecodeRawTransactionTxOut_ptr_UniValue_ptr *)__args);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff520,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args);
    this_00 = local_60;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::operator=
              (in_stack_fffffffffffff510,in_stack_fffffffffffff508);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::
    ~CLASS_FUNCTION_TABLE(in_stack_fffffffffffff510);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
            ::
            emplace<char_const(&)[11],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
                      (this_00,__args,in_stack_fffffffffffff510);
    local_8b9.set_function.super__Function_base._M_functor._1_8_ = pVar2.first._M_node;
    local_8b9.set_function.super__Function_base._M_functor._M_pod_data[9] = pVar2.second;
    this = &local_8b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               ((long)local_8b9.get_function.super__Function_base._M_functor._M_pod_data + 1),
               "rangeproof",(allocator *)this);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,
                (value_type *)
                ((long)local_8b9.get_function.super__Function_base._M_functor._M_pod_data + 1));
    std::__cxx11::string::~string
              ((string *)
               ((long)local_8b9.get_function.super__Function_base._M_functor._M_pod_data + 1));
    std::allocator<char>::~allocator((allocator<char> *)&local_8b9);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::
    ~CLASS_FUNCTION_TABLE(this);
  }
  return;
}

Assistant:

void ElementsDecodeRawTransactionTxOut::CollectFieldName() {
  if (!json_mapper.empty()) {
    return;
  }
  cfd::core::CLASS_FUNCTION_TABLE<ElementsDecodeRawTransactionTxOut> func_table;  // NOLINT

  func_table = {
    ElementsDecodeRawTransactionTxOut::GetValueString,
    ElementsDecodeRawTransactionTxOut::SetValueString,
    ElementsDecodeRawTransactionTxOut::GetValueFieldType,
  };
  json_mapper.emplace("value", func_table);
  item_list.push_back("value");
  func_table = {
    ElementsDecodeRawTransactionTxOut::GetValue_minimumString,
    ElementsDecodeRawTransactionTxOut::SetValue_minimumString,
    ElementsDecodeRawTransactionTxOut::GetValue_minimumFieldType,
  };
  json_mapper.emplace("value-minimum", func_table);
  item_list.push_back("value-minimum");
  func_table = {
    ElementsDecodeRawTransactionTxOut::GetValue_maximumString,
    ElementsDecodeRawTransactionTxOut::SetValue_maximumString,
    ElementsDecodeRawTransactionTxOut::GetValue_maximumFieldType,
  };
  json_mapper.emplace("value-maximum", func_table);
  item_list.push_back("value-maximum");
  func_table = {
    ElementsDecodeRawTransactionTxOut::GetCt_exponentString,
    ElementsDecodeRawTransactionTxOut::SetCt_exponentString,
    ElementsDecodeRawTransactionTxOut::GetCt_exponentFieldType,
  };
  json_mapper.emplace("ct-exponent", func_table);
  item_list.push_back("ct-exponent");
  func_table = {
    ElementsDecodeRawTransactionTxOut::GetCt_bitsString,
    ElementsDecodeRawTransactionTxOut::SetCt_bitsString,
    ElementsDecodeRawTransactionTxOut::GetCt_bitsFieldType,
  };
  json_mapper.emplace("ct-bits", func_table);
  item_list.push_back("ct-bits");
  func_table = {
    ElementsDecodeRawTransactionTxOut::GetSurjectionproofString,
    ElementsDecodeRawTransactionTxOut::SetSurjectionproofString,
    ElementsDecodeRawTransactionTxOut::GetSurjectionproofFieldType,
  };
  json_mapper.emplace("surjectionproof", func_table);
  item_list.push_back("surjectionproof");
  func_table = {
    ElementsDecodeRawTransactionTxOut::GetValuecommitmentString,
    ElementsDecodeRawTransactionTxOut::SetValuecommitmentString,
    ElementsDecodeRawTransactionTxOut::GetValuecommitmentFieldType,
  };
  json_mapper.emplace("valuecommitment", func_table);
  item_list.push_back("valuecommitment");
  func_table = {
    ElementsDecodeRawTransactionTxOut::GetAssetString,
    ElementsDecodeRawTransactionTxOut::SetAssetString,
    ElementsDecodeRawTransactionTxOut::GetAssetFieldType,
  };
  json_mapper.emplace("asset", func_table);
  item_list.push_back("asset");
  func_table = {
    ElementsDecodeRawTransactionTxOut::GetAssetcommitmentString,
    ElementsDecodeRawTransactionTxOut::SetAssetcommitmentString,
    ElementsDecodeRawTransactionTxOut::GetAssetcommitmentFieldType,
  };
  json_mapper.emplace("assetcommitment", func_table);
  item_list.push_back("assetcommitment");
  func_table = {
    ElementsDecodeRawTransactionTxOut::GetCommitmentnonceString,
    ElementsDecodeRawTransactionTxOut::SetCommitmentnonceString,
    ElementsDecodeRawTransactionTxOut::GetCommitmentnonceFieldType,
  };
  json_mapper.emplace("commitmentnonce", func_table);
  item_list.push_back("commitmentnonce");
  func_table = {
    ElementsDecodeRawTransactionTxOut::GetCommitmentnonce_fully_validString,
    ElementsDecodeRawTransactionTxOut::SetCommitmentnonce_fully_validString,
    ElementsDecodeRawTransactionTxOut::GetCommitmentnonce_fully_validFieldType,
  };
  json_mapper.emplace("commitmentnonce_fully_valid", func_table);
  item_list.push_back("commitmentnonce_fully_valid");
  func_table = {
    ElementsDecodeRawTransactionTxOut::GetNString,
    ElementsDecodeRawTransactionTxOut::SetNString,
    ElementsDecodeRawTransactionTxOut::GetNFieldType,
  };
  json_mapper.emplace("n", func_table);
  item_list.push_back("n");
  func_table = {
    ElementsDecodeRawTransactionTxOut::GetScriptPubKeyString,
    ElementsDecodeRawTransactionTxOut::SetScriptPubKeyString,
    ElementsDecodeRawTransactionTxOut::GetScriptPubKeyFieldType,
  };
  json_mapper.emplace("scriptPubKey", func_table);
  item_list.push_back("scriptPubKey");
  func_table = {
    ElementsDecodeRawTransactionTxOut::GetRangeproofString,
    ElementsDecodeRawTransactionTxOut::SetRangeproofString,
    ElementsDecodeRawTransactionTxOut::GetRangeproofFieldType,
  };
  json_mapper.emplace("rangeproof", func_table);
  item_list.push_back("rangeproof");
}